

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

bool __thiscall capnp::_::SegmentBuilder::tryExtend(SegmentBuilder *this,word *from,word *to)

{
  if (((this->pos == from) && (from <= to)) &&
     (to <= (this->super_SegmentReader).ptr.ptr + (this->super_SegmentReader).ptr.size_)) {
    this->pos = to;
    return true;
  }
  return false;
}

Assistant:

inline bool SegmentBuilder::tryExtend(word* from, word* to) {
  // Careful about overflow.
  if (pos == from && to <= ptr.end() && to >= from) {
    pos = to;
    return true;
  } else {
    return false;
  }
}